

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  long *plVar1;
  int iVar2;
  Extension *pEVar3;
  MessageLite *this_00;
  Descriptor *pDVar4;
  Nonnull<const_char_*> pcVar5;
  
  pEVar3 = FindOrNull(this,descriptor->number_);
  if (pEVar3 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  if (pEVar3->is_repeated == true) {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (3,1,
                        "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_OPTIONAL"
                       );
  }
  else {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    if ((ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pEVar3->type * 4) == 10) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                                          (ulong)pEVar3->type * 4),10,
                          "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
    }
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      if ((pEVar3->field_0xa & 4) == 0) {
        this_00 = (MessageLite *)(pEVar3->field_0).int64_t_value;
        if (this->arena_ != (Arena *)0x0) {
          this_00 = MessageLite::New(this_00,(Arena *)0x0);
          MessageLite::CheckTypeAndMergeFrom(this_00,(MessageLite *)pEVar3->field_0);
        }
      }
      else {
        plVar1 = *(long **)&(pEVar3->field_0).int32_t_value;
        pDVar4 = FieldDescriptor::message_type(descriptor);
        iVar2 = (*factory->_vptr_MessageFactory[2])(factory,pDVar4);
        this_00 = (MessageLite *)(**(code **)(*plVar1 + 0x40))(plVar1,iVar2,this->arena_);
        if ((this->arena_ == (Arena *)0x0) &&
           ((long *)(pEVar3->field_0).int64_t_value != (long *)0x0)) {
          (**(code **)(*(long *)(pEVar3->field_0).int64_t_value + 8))();
        }
      }
      Erase(this,descriptor->number_);
      return this_00;
    }
  }
  else {
    ReleaseMessage();
  }
  ReleaseMessage();
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      ret = extension->ptr.lazymessage_value->ReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()), arena_);
      if (arena_ == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      if (arena_ != nullptr) {
        ret = extension->ptr.message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->ptr.message_value);
      } else {
        ret = extension->ptr.message_value;
      }
    }
    Erase(descriptor->number());
    return ret;
  }
}